

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

uniformNdv gl4cts::GLSL420Pack::Utils::getUniformNdv(Functions *gl,GLuint n_rows)

{
  TestError *this;
  uniformNdv local_20;
  uniformNdv result;
  GLuint n_rows_local;
  Functions *gl_local;
  
  switch(n_rows) {
  case 1:
    local_20 = gl->uniform1dv;
    break;
  case 2:
    local_20 = gl->uniform2dv;
    break;
  case 3:
    local_20 = gl->uniform3dv;
    break;
  case 4:
    local_20 = gl->uniform4dv;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid number of rows",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x2c5);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

Utils::uniformNdv Utils::getUniformNdv(const glw::Functions& gl, glw::GLuint n_rows)
{
	uniformNdv result = 0;

	switch (n_rows)
	{
	case 1:
		result = gl.uniform1dv;
		break;
	case 2:
		result = gl.uniform2dv;
		break;
	case 3:
		result = gl.uniform3dv;
		break;
	case 4:
		result = gl.uniform4dv;
		break;
	default:
		TCU_FAIL("Invalid number of rows");
	}

	return result;
}